

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TDeletingArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::~TDeletingArray
          (TDeletingArray<FInternalLightAssociation_*,_FInternalLightAssociation_*> *this)

{
  uint uVar1;
  FInternalLightAssociation **ppFVar2;
  uint local_14;
  uint i;
  TDeletingArray<FInternalLightAssociation_*,_FInternalLightAssociation_*> *this_local;
  
  for (local_14 = 0;
      uVar1 = TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::Size
                        (&this->
                          super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>),
      local_14 < uVar1; local_14 = local_14 + 1) {
    ppFVar2 = TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::operator[]
                        (&this->
                          super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>,
                         (ulong)local_14);
    if (*ppFVar2 != (FInternalLightAssociation *)0x0) {
      ppFVar2 = TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::operator[]
                          (&this->
                            super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>,
                           (ulong)local_14);
      if (*ppFVar2 != (FInternalLightAssociation *)0x0) {
        operator_delete(*ppFVar2,0x10);
      }
    }
  }
  TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::~TArray
            (&this->super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}